

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp.c
# Opt level: O0

void lejp_check_path_match(lejp_ctx *ctx)

{
  byte bVar1;
  bool bVar2;
  size_t local_30;
  size_t s;
  char *pcStack_20;
  int n;
  char *q;
  char *p;
  lejp_ctx *ctx_local;
  
  local_30 = 8;
  if (ctx->path_stride != 0) {
    local_30 = ctx->path_stride;
  }
  s._4_4_ = 0;
  do {
    bVar2 = false;
    if (ctx->path_match == '\0') {
      bVar2 = s._4_4_ < (int)(uint)ctx->pst[ctx->pst_sp].count_paths;
    }
    if (!bVar2) {
      if (ctx->path_match != '\0') {
        return;
      }
      ctx->wildcount = '\0';
      return;
    }
    ctx->wildcount = '\0';
    q = ctx->path;
    pcStack_20 = *(char **)((long)ctx->pst[ctx->pst_sp].paths + (long)s._4_4_ * local_30);
    while( true ) {
      bVar2 = false;
      if (*q != '\0') {
        bVar2 = *pcStack_20 != '\0';
      }
      if (!bVar2) break;
      if (*pcStack_20 == '*') {
        bVar1 = ctx->wildcount;
        ctx->wildcount = bVar1 + 1;
        ctx->wild[bVar1] = (short)q - ((short)ctx + 0xec);
        pcStack_20 = pcStack_20 + 1;
        while( true ) {
          bVar2 = false;
          if ((*q != '\0') && (bVar2 = true, *q == '.')) {
            bVar2 = *pcStack_20 == '\0';
          }
          if (!bVar2) break;
          q = q + 1;
        }
      }
      else {
        if (*q != *pcStack_20) break;
        q = q + 1;
        pcStack_20 = pcStack_20 + 1;
      }
    }
    if ((*q == '\0') && (*pcStack_20 == '\0')) {
      ctx->path_match = (char)s._4_4_ + '\x01';
      ctx->path_match_len = ctx->pst[ctx->pst_sp].ppos;
      return;
    }
    s._4_4_ = s._4_4_ + 1;
  } while( true );
}

Assistant:

void
lejp_check_path_match(struct lejp_ctx *ctx)
{
	const char *p, *q;
	int n;
	size_t s = sizeof(char *);

	if (ctx->path_stride)
		s = ctx->path_stride;

	/* we only need to check if a match is not active */
	for (n = 0; !ctx->path_match &&
	     n < ctx->pst[ctx->pst_sp].count_paths; n++) {
		ctx->wildcount = 0;
		p = ctx->path;

		q = *((char **)(((char *)ctx->pst[ctx->pst_sp].paths) + (n * s)));

		while (*p && *q) {
			if (*q != '*') {
				if (*p != *q)
					break;
				p++;
				q++;
				continue;
			}
			ctx->wild[ctx->wildcount++] = lws_ptr_diff(p, ctx->path);
			q++;
			/*
			 * if * has something after it, match to .
			 * if ends with *, eat everything.
			 * This implies match sequences must be ordered like
			 *  x.*.*
			 *  x.*
			 * if both options are possible
			 */
			while (*p && (*p != '.' || !*q))
				p++;
		}
		if (*p || *q)
			continue;

		ctx->path_match = n + 1;
		ctx->path_match_len = ctx->pst[ctx->pst_sp].ppos;
		return;
	}

	if (!ctx->path_match)
		ctx->wildcount = 0;
}